

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_16.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
read_numbers(vector<double,_std::allocator<double>_> *__return_storage_ptr__,string *fname)

{
  uint uVar1;
  iterator __position;
  istream *piVar2;
  double num;
  ifstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  double local_228 [4];
  uint auStack_208 [122];
  
  std::ifstream::ifstream(local_228,(string *)fname,_S_in);
  if ((*(byte *)((long)auStack_208 + *(long *)((long)local_228[0] + -0x18)) & 5) != 0) {
    file_open_err(fname,in);
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._M_dataplus._M_p = (pointer)0x0;
  while( true ) {
    piVar2 = std::istream::_M_extract<double>(local_228);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                 (double *)&local_248);
    }
    else {
      *__position._M_current = (double)local_248._M_dataplus._M_p;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  uVar1 = *(uint *)((long)auStack_208 + *(long *)((long)local_228[0] + -0x18));
  if ((char)((uVar1 & 2) >> 1) == '\0' && (uVar1 & 5) != 0) {
    std::operator+(&local_248,"Failed to read data from file ",fname);
    error(&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
  }
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> read_numbers(const std::string& fname)
{
	auto file = std::ifstream{ fname };
	if (!file)
	{
		file_open_err(fname, FileType::in);
	}
	auto numbers = std::vector<double>();
	for (auto num = 0.0; file >> num;)
	{
		numbers.push_back(num);
	}
	if ((file.bad() || file.fail()) && !file.eof())
	{
		error("Failed to read data from file " + fname);
	}
	return numbers;
}